

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphIO.cpp
# Opt level: O3

ErrorCode Escape::loadGraph(char *path,Graph *graph,int undirected,IOFormat fmt)

{
  char cVar1;
  VertexIdx *pVVar2;
  ErrorCode EVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  VertexIdx *pVVar7;
  long lVar8;
  int64_t i1;
  char line [1024];
  long local_450;
  VertexIdx local_448;
  ulong local_440;
  char local_438;
  char local_437 [1031];
  
  EVar3 = ecUnsupportedFormat;
  if (fmt == escape) {
    __stream = fopen(path,"r");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"could not open file %s\n",path);
      EVar3 = ecInvalidInput;
    }
    else {
      graph->nVertices = 0;
      pcVar5 = fgets(&local_438,0x400,__stream);
      if (pcVar5 == (char *)0x0) {
        lVar8 = 0;
      }
      else {
        local_440 = (ulong)(undirected != 0);
        lVar8 = 0;
        do {
          if ((local_438 != '\0') && (pcVar5 = local_437, cVar1 = local_438, local_438 != '#')) {
            do {
              iVar4 = isspace((int)cVar1);
              if (iVar4 == 0) {
                __isoc99_sscanf(&local_438,"%lld%lld",&local_448,&local_450);
                if (graph->nVertices == 0) {
                  graph->nVertices = local_448;
                  uVar6 = local_450 << ((byte)local_440 & 0x3f);
                  graph->nEdges = uVar6;
                  uVar6 = -(ulong)(uVar6 >> 0x3d != 0) | uVar6 << 3;
                  pVVar7 = (VertexIdx *)operator_new__(uVar6);
                  graph->srcs = pVVar7;
                  pVVar7 = (VertexIdx *)operator_new__(uVar6);
                  graph->dsts = pVVar7;
                }
                else {
                  pVVar7 = graph->srcs;
                  pVVar7[lVar8] = local_448;
                  pVVar2 = graph->dsts;
                  pVVar2[lVar8] = local_450;
                  if (undirected == 0) {
                    lVar8 = lVar8 + 1;
                  }
                  else {
                    pVVar7[lVar8 + 1] = local_450;
                    pVVar2[lVar8 + 1] = local_448;
                    lVar8 = lVar8 + 2;
                  }
                }
                break;
              }
              cVar1 = *pcVar5;
              pcVar5 = pcVar5 + 1;
            } while (cVar1 != '\0');
          }
          pcVar5 = fgets(&local_438,0x400,__stream);
        } while (pcVar5 != (char *)0x0);
      }
      fclose(__stream);
      EVar3 = ecNone;
      if (lVar8 < graph->nEdges) {
        fprintf(_stderr,"expected %lld edges, only got %lld\n",graph->nEdges,lVar8);
        EVar3 = ecIOError;
      }
    }
  }
  return EVar3;
}

Assistant:

ErrorCode Escape::loadGraph(const char *path, Graph &graph, int undirected, IOFormat fmt) {
    switch (fmt) {
        case IOFormat::escape:
            return loadGraph_Escape(path, graph, undirected);
        default:
            return ecUnsupportedFormat;
    }
}